

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

PropertyStringCacheMap * __thiscall
Js::JavascriptLibrary::EnsurePropertyStringMap(JavascriptLibrary *this)

{
  Type *addr;
  Recycler *alloc;
  SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
  *this_00;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  addr = &this->propertyStringMap;
  if ((this->propertyStringMap).ptr ==
      (WeakReferenceRegionDictionary<int,_Js::PropertyString_*,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock>
       *)0x0) {
    local_48 = (undefined1  [8])
               &JsUtil::
                WeakReferenceRegionDictionary<int,Js::PropertyString*,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::NoResizeLock>
                ::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_766a001;
    data.filename._0_4_ = 0x1b20;
    alloc = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_48);
    this_00 = (SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
               *)new<Memory::Recycler>(0x40,alloc,0x38bbb2);
    JsUtil::
    SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
    ::SplitWeakDictionary(this_00,this->recycler,0x47);
    (this_00->super_IWeakReferenceDictionary)._vptr_IWeakReferenceDictionary =
         (_func_int **)&PTR_Cleanup_01542c88;
    Memory::Recycler::WBSetBit((char *)addr);
    (this->propertyStringMap).ptr =
         (WeakReferenceRegionDictionary<int,_Js::PropertyString_*,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock>
          *)this_00;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    ScriptContext::RegisterWeakReferenceDictionary
              ((this->super_JavascriptLibraryBase).scriptContext.ptr,
               (IWeakReferenceDictionary *)(this->propertyStringMap).ptr);
  }
  return addr->ptr;
}

Assistant:

PropertyStringCacheMap* JavascriptLibrary::EnsurePropertyStringMap()
    {
        if (this->propertyStringMap == nullptr)
        {
            this->propertyStringMap = RecyclerNew(this->recycler, PropertyStringCacheMap, this->GetRecycler(), 71);
            this->scriptContext->RegisterWeakReferenceDictionary((JsUtil::IWeakReferenceDictionary*) this->propertyStringMap);
        }
        return this->propertyStringMap;
    }